

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int GetLatestDataFromThreadNMEADevicex(NMEADEVICE *pNMEADevice,NMEADATA *pNMEAData)

{
  int iVar1;
  int local_24;
  int res;
  int id;
  NMEADATA *pNMEAData_local;
  NMEADEVICE *pNMEADevice_local;
  
  local_24 = 0;
  do {
    if ((NMEADEVICE *)addrsNMEADevice[local_24] == pNMEADevice) {
      EnterCriticalSection(NMEADeviceCS + local_24);
      memcpy(pNMEAData,nmeadataNMEADevice + local_24,0x3d8);
      iVar1 = resNMEADevice[local_24];
      LeaveCriticalSection(NMEADeviceCS + local_24);
      return iVar1;
    }
    local_24 = local_24 + 1;
  } while (local_24 < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int GetLatestDataFromThreadNMEADevicex(NMEADEVICE* pNMEADevice, NMEADATA* pNMEAData)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsNMEADevice[id] != pNMEADevice)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	EnterCriticalSection(&NMEADeviceCS[id]);
	*pNMEAData = nmeadataNMEADevice[id];
	res = resNMEADevice[id];
	LeaveCriticalSection(&NMEADeviceCS[id]);

	return res;
}